

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

mat4 * mat4_shear(mat4 *__return_storage_ptr__,float theta,vec3 a,vec3 b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float local_28;
  float fStack_24;
  float local_18;
  float fStack_14;
  
  fVar3 = b.z;
  fVar2 = a.z;
  fVar1 = tanf(theta);
  local_28 = a.x;
  fStack_24 = a.y;
  local_18 = b.x;
  fStack_14 = b.y;
  __return_storage_ptr__->m[0] = local_28 * local_18 * fVar1 + 1.0;
  __return_storage_ptr__->m[1] = local_28 * fStack_14 * fVar1;
  __return_storage_ptr__->m[2] = local_28 * fVar3 * fVar1;
  __return_storage_ptr__->m[3] = 0.0;
  __return_storage_ptr__->m[4] = fStack_24 * local_18 * fVar1;
  __return_storage_ptr__->m[5] = fStack_24 * fStack_14 * fVar1 + 1.0;
  __return_storage_ptr__->m[6] = fStack_24 * fVar3 * fVar1;
  __return_storage_ptr__->m[7] = 0.0;
  __return_storage_ptr__->m[8] = local_18 * fVar2 * fVar1;
  __return_storage_ptr__->m[9] = fStack_14 * fVar2 * fVar1;
  __return_storage_ptr__->m[10] = fVar2 * fVar3 * fVar1 + 1.0;
  __return_storage_ptr__->m[0xb] = 0.0;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_shear(float theta, vec3 a, vec3 b) {
    float t = tanf(theta);
    return mat4_create(
            a.x * b.x * t + 1.0f, a.x * b.y * t, a.x * b.z * t, 0.0f,
            a.y * b.x * t, a.y * b.y * t + 1.0f, a.y * b.z * t, 0.0f,
            a.z * b.x * t, a.z * b.y * t, a.z * b.z * t + 1.0f, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}